

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_packet_socket.c
# Opt level: O1

void oonf_packet_remove(oonf_packet_socket *pktsocket,_Bool force)

{
  int __fd;
  list_entity *plVar1;
  list_entity *plVar2;
  
  if (((pktsocket->node).next != (list_entity *)0x0) &&
     ((pktsocket->node).prev != (list_entity *)0x0)) {
    oonf_socket_remove(&pktsocket->scheduler_entry);
    __fd = (pktsocket->scheduler_entry).fd.fd;
    if (__fd != -1) {
      close(__fd);
      (pktsocket->scheduler_entry).fd.fd = -1;
    }
    abuf_free(&pktsocket->out);
    plVar1 = (pktsocket->node).next;
    plVar2 = (pktsocket->node).prev;
    plVar2->next = plVar1;
    plVar1->prev = plVar2;
    (pktsocket->node).next = (list_entity *)0x0;
    (pktsocket->node).prev = (list_entity *)0x0;
  }
  return;
}

Assistant:

void
oonf_packet_remove(struct oonf_packet_socket *pktsocket, bool force __attribute__((unused))) {
  // TODO: implement non-force behavior for UDP sockets
  if (list_is_node_added(&pktsocket->node)) {
    oonf_socket_remove(&pktsocket->scheduler_entry);
    os_fd_close(&pktsocket->scheduler_entry.fd);
    abuf_free(&pktsocket->out);

    list_remove(&pktsocket->node);
  }
}